

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O3

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC1TL3SLLastIsScaled_Test::
~DatarateTestSVC_BasicRateTargetingSVC1TL3SLLastIsScaled_Test
          (DatarateTestSVC_BasicRateTargetingSVC1TL3SLLastIsScaled_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__DatarateTestSVC_010318f0;
  *(undefined ***)this = &PTR__DatarateTestSVC_01031b08;
  *(undefined ***)(this + 8) = &PTR__DatarateTestSVC_01031b28;
  if (*(void **)(this + 0x4c0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x4c0));
  }
  *(undefined ***)(this + 8) = &PTR__EncoderTest_0103d9f8;
  if (*(DatarateTestSVC_BasicRateTargetingSVC1TL3SLLastIsScaled_Test **)(this + 0x3b0) !=
      this + 0x3c0) {
    operator_delete(*(DatarateTestSVC_BasicRateTargetingSVC1TL3SLLastIsScaled_Test **)(this + 0x3b0)
                   );
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x10));
  operator_delete((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                   *)(this + -0x10));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC1TL3SLLastIsScaled) {
  BasicRateTargetingSVC1TL3SLLastIsScaledTest();
}